

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_sinc_resampler.cc
# Opt level: O3

size_t __thiscall
webrtc::PushSincResampler::Resample
          (PushSincResampler *this,int16_t *source,size_t source_length,int16_t *destination,
          size_t destination_capacity)

{
  ulong destination_capacity_00;
  float *destination_00;
  
  destination_00 =
       (this->float_buffer_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  destination_capacity_00 = this->destination_frames_;
  if (destination_00 == (float *)0x0) {
    destination_00 =
         (float *)operator_new__(-(ulong)(destination_capacity_00 >> 0x3e != 0) |
                                 destination_capacity_00 * 4);
    (this->float_buffer_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = destination_00;
  }
  this->source_ptr_int_ = source;
  Resample(this,(float *)0x0,source_length,destination_00,destination_capacity_00);
  FloatS16ToS16((this->float_buffer_)._M_t.
                super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                super__Head_base<0UL,_float_*,_false>._M_head_impl,this->destination_frames_,
                destination);
  this->source_ptr_int_ = (int16_t *)0x0;
  return this->destination_frames_;
}

Assistant:

size_t PushSincResampler::Resample(const int16_t* source,
                                   size_t source_length,
                                   int16_t* destination,
                                   size_t destination_capacity) {
  if (!float_buffer_.get())
    float_buffer_.reset(new float[destination_frames_]);

  source_ptr_int_ = source;
  // Pass nullptr as the float source to have Run() read from the int16 source.
  Resample(nullptr, source_length, float_buffer_.get(), destination_frames_);
  FloatS16ToS16(float_buffer_.get(), destination_frames_, destination);
  source_ptr_int_ = nullptr;
  return destination_frames_;
}